

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O0

FT_Error FT_Load_Sfnt_Table(FT_Face face,FT_ULong tag,FT_Long offset,FT_Byte *buffer,
                           FT_ULong *length)

{
  FT_Driver pFVar1;
  undefined8 *local_50;
  FT_Pointer _tmp_;
  FT_Module module;
  FT_Service_SFNT_Table service;
  FT_ULong *length_local;
  FT_Byte *buffer_local;
  FT_Long offset_local;
  FT_ULong tag_local;
  FT_Face face_local;
  
  if ((face == (FT_Face)0x0) || ((face->face_flags & 8U) == 0)) {
    face_local._4_4_ = 0x23;
  }
  else {
    pFVar1 = face->driver;
    local_50 = (undefined8 *)0x0;
    if (((pFVar1->root).clazz)->get_interface != (FT_Module_Requester)0x0) {
      local_50 = (undefined8 *)(*((pFVar1->root).clazz)->get_interface)(&pFVar1->root,"sfnt-table");
    }
    if (local_50 == (undefined8 *)0x0) {
      face_local._4_4_ = 7;
    }
    else {
      face_local._4_4_ = (*(code *)*local_50)(face,tag,offset,buffer,length);
    }
  }
  return face_local._4_4_;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Load_Sfnt_Table( FT_Face    face,
                      FT_ULong   tag,
                      FT_Long    offset,
                      FT_Byte*   buffer,
                      FT_ULong*  length )
  {
    FT_Service_SFNT_Table  service;


    if ( !face || !FT_IS_SFNT( face ) )
      return FT_THROW( Invalid_Face_Handle );

    FT_FACE_FIND_SERVICE( face, service, SFNT_TABLE );
    if ( !service )
      return FT_THROW( Unimplemented_Feature );

    return service->load_table( face, tag, offset, buffer, length );
  }